

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O2

void missmm(monst *magr,monst *mdef,attack *mattk)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  char *__format;
  char mdef_name [256];
  char buf [256];
  
  if (vis == '\0') {
    noises(magr,mattk);
    return;
  }
  if (magr->wormno == '\0') {
    if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001beee6;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001beedd;
      }
      else {
LAB_001beedd:
        if (ublindf == (obj *)0x0) goto LAB_001bef94;
LAB_001beee6:
        if (ublindf->oartifact != '\x1d') goto LAB_001bef94;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[magr->my][magr->mx] & 1U) == 0)
          ) || ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001bef94;
    }
LAB_001bef41:
    uVar1 = *(uint *)&magr->field_0x60;
    if ((((uVar1 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001bef87;
      goto LAB_001bef94;
    }
    if ((uVar1 & 0x280) != 0) goto LAB_001bef94;
LAB_001bef87:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001bef94;
  }
  else {
    bVar2 = worm_known(level,magr);
    if (bVar2 != '\0') goto LAB_001bef41;
LAB_001bef94:
    if (((magr->data->mflags1 & 0x10000) == 0) &&
       ((poVar4 = which_armor(magr,4), poVar4 == (obj *)0x0 ||
        (poVar4 = which_armor(magr,4), poVar4->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001befe9;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001befe4;
      }
      else {
LAB_001befe4:
        if (ublindf != (obj *)0x0) {
LAB_001befe9:
          if (ublindf->oartifact == '\x1d') goto LAB_001bf083;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001bf0fc;
      }
LAB_001bf083:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar3 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
      goto LAB_001bf0fc;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(magr), bVar2 == '\0')))) {
      map_invisible(magr->mx,magr->my);
    }
  }
LAB_001bf0fc:
  if (mdef->wormno == '\0') {
    if ((viz_array[mdef->my][mdef->mx] & 2U) != 0) goto LAB_001bf1bf;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bf164;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bf15b;
    }
    else {
LAB_001bf15b:
      if (ublindf == (obj *)0x0) goto LAB_001bf213;
LAB_001bf164:
      if (ublindf->oartifact != '\x1d') goto LAB_001bf213;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mdef->my][mdef->mx] & 1U) != 0))
       && ((mdef->data->mflags3 & 0x200) != 0)) goto LAB_001bf1bf;
  }
  else {
    bVar2 = worm_known(level,mdef);
    if (bVar2 != '\0') {
LAB_001bf1bf:
      uVar1 = *(uint *)&mdef->field_0x60;
      if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar1 & 0x280) == 0) goto LAB_001bf206;
      }
      else if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bf206:
        if ((u._1052_1_ & 0x20) == 0) goto LAB_001bf37f;
      }
    }
  }
LAB_001bf213:
  if (((mdef->data->mflags1 & 0x10000) == 0) &&
     ((poVar4 = which_armor(mdef,4), poVar4 == (obj *)0x0 ||
      (poVar4 = which_armor(mdef,4), poVar4->otyp != 0x4f)))) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bf268;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bf263;
    }
    else {
LAB_001bf263:
      if (ublindf != (obj *)0x0) {
LAB_001bf268:
        if (ublindf->oartifact == '\x1d') goto LAB_001bf302;
      }
      if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
           youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001bf37f;
    }
LAB_001bf302:
    if ((u.uprops[0x19].extrinsic != 0) &&
       ((u.uprops[0x19].blocked == 0 &&
        (iVar3 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
    goto LAB_001bf37f;
  }
  if ((u.uprops[0x42].intrinsic == 0) &&
     ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(mdef), bVar2 == '\0')))) {
    map_invisible(mdef->mx,mdef->my);
  }
LAB_001bf37f:
  if (mdef->m_ap_type != '\0') {
    seemimic(mdef);
  }
  if (magr->m_ap_type != '\0') {
    seemimic(magr);
  }
  iVar3 = could_seduce(magr,mdef,mattk);
  if (iVar3 == 0) {
    __format = "%s misses";
  }
  else {
    __format = "%s misses";
    if ((magr->field_0x61 & 1) == 0) {
      __format = "%s pretends to be friendly to";
    }
  }
  pcVar5 = Monnam(magr);
  sprintf(buf,__format,pcVar5);
  mon_nam_too(mdef_name,mdef,magr);
  pline("%s %s.",buf,mdef_name);
  return;
}

Assistant:

static void missmm(struct monst *magr, struct monst *mdef, const struct attack *mattk)
{
	const char *fmt;
	char buf[BUFSZ], mdef_name[BUFSZ];

	if (vis) {
		if (!canspotmon(level, magr))
		    map_invisible(magr->mx, magr->my);
		if (!canspotmon(level, mdef))
		    map_invisible(mdef->mx, mdef->my);
		if (mdef->m_ap_type) seemimic(mdef);
		if (magr->m_ap_type) seemimic(magr);
		fmt = (could_seduce(magr,mdef,mattk) && !magr->mcan) ?
			"%s pretends to be friendly to" : "%s misses";
		sprintf(buf, fmt, Monnam(magr));
		pline("%s %s.", buf, mon_nam_too(mdef_name, mdef, magr));
	} else  noises(magr, mattk);
}